

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O3

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  secp256k1_gej *psVar6;
  secp256k1_gej *psVar7;
  uint uVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  secp256k1_ge_storage local_e8;
  secp256k1_scalar local_a4;
  secp256k1_ge local_84;
  
  psVar6 = &ctx->initial;
  psVar7 = r;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    (psVar7->x).n[0] = (psVar6->x).n[0];
    psVar6 = (secp256k1_gej *)((psVar6->x).n + 1);
    psVar7 = (secp256k1_gej *)((psVar7->x).n + 1);
  }
  secp256k1_scalar_add(&local_a4,gn,&ctx->blind);
  local_84.infinity = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  uVar14 = 0;
  lVar2 = 0x30;
  uVar5 = 0;
  uVar15 = 0;
  uVar16 = 0;
  uVar17 = 0;
  uVar18 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0;
  uVar22 = 0;
  uVar23 = 0;
  uVar24 = 0;
  uVar25 = 0;
  uVar26 = 0;
  do {
    puVar1 = (uint *)((long)(*ctx->prec)[0][0].x.n + lVar2);
    lVar3 = 0;
    do {
      lVar4 = lVar3 + 1;
      auVar10._0_4_ = -(uint)((int)lVar4 == 0x10);
      auVar10._4_4_ = -(uint)((int)((ulong)lVar4 >> 0x20) == 0);
      auVar10._8_4_ =
           -(uint)((uint)lVar3 ==
                  (local_a4.d[uVar5 >> 3 & 0x1fffffff] >> ((char)uVar5 * '\x04' & 0x1fU) & 0xf));
      auVar10._12_4_ = -(uint)((int)((ulong)lVar3 >> 0x20) == 0);
      auVar8._4_4_ = auVar10._0_4_;
      auVar8._0_4_ = auVar10._4_4_;
      auVar8._8_4_ = auVar10._12_4_;
      auVar8._12_4_ = auVar10._8_4_;
      uVar9 = SUB164(auVar8 & auVar10,8);
      uVar11 = puVar1[-0xc] & uVar9 | ~uVar9 & uVar11;
      uVar12 = puVar1[-0xb] & uVar9 | ~uVar9 & uVar12;
      uVar13 = puVar1[-10] & uVar9 | ~uVar9 & uVar13;
      uVar14 = puVar1[-9] & uVar9 | ~uVar9 & uVar14;
      uVar15 = puVar1[-8] & uVar9 | ~uVar9 & uVar15;
      uVar16 = puVar1[-7] & uVar9 | ~uVar9 & uVar16;
      uVar17 = puVar1[-6] & uVar9 | ~uVar9 & uVar17;
      uVar18 = puVar1[-5] & uVar9 | ~uVar9 & uVar18;
      uVar19 = puVar1[-4] & uVar9 | ~uVar9 & uVar19;
      uVar20 = puVar1[-3] & uVar9 | ~uVar9 & uVar20;
      uVar21 = puVar1[-2] & uVar9 | ~uVar9 & uVar21;
      uVar22 = puVar1[-1] & uVar9 | ~uVar9 & uVar22;
      uVar23 = ~uVar9 & uVar23 | *puVar1 & uVar9;
      uVar24 = ~uVar9 & uVar24 | puVar1[1] & uVar9;
      uVar25 = ~uVar9 & uVar25 | puVar1[2] & uVar9;
      uVar26 = ~uVar9 & uVar26 | puVar1[3] & uVar9;
      puVar1 = puVar1 + 0x10;
      lVar3 = lVar4;
    } while ((auVar8 & auVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
    local_e8.x.n[0] = uVar11;
    local_e8.x.n[1] = uVar12;
    local_e8.x.n[2] = uVar13;
    local_e8.x.n[3] = uVar14;
    local_e8.x.n[4] = uVar15;
    local_e8.x.n[5] = uVar16;
    local_e8.x.n[6] = uVar17;
    local_e8.x.n[7] = uVar18;
    local_e8.y.n[0] = uVar19;
    local_e8.y.n[1] = uVar20;
    local_e8.y.n[2] = uVar21;
    local_e8.y.n[3] = uVar22;
    local_e8.y.n[4] = uVar23;
    local_e8.y.n[5] = uVar24;
    local_e8.y.n[6] = uVar25;
    local_e8.y.n[7] = uVar26;
    secp256k1_ge_from_storage(&local_84,&local_e8);
    secp256k1_gej_add_ge(r,r,&local_84);
    uVar5 = uVar5 + 1;
    lVar2 = lVar2 + 0x400;
  } while (uVar5 != 0x40);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < 64; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * 4, 4);
        for (i = 0; i < 16; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}